

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_custom_check.cpp
# Opt level: O2

void __thiscall money_t::~money_t(money_t *this)

{
  this->_vptr_money_t = (_func_int **)&PTR__money_t_00108d90;
  std::__cxx11::string::~string((string *)&this->currency_);
  return;
}

Assistant:

virtual ~money_t() {}